

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msatSolverIo.c
# Opt level: O2

void Msat_SolverPrintAssignment(Msat_Solver_t *p)

{
  uint __c;
  uint uVar1;
  ulong uVar2;
  
  puts("Current assignments are: ");
  for (uVar1 = 0; (int)uVar1 < p->nVars; uVar1 = uVar1 + 1) {
    printf("%d",(ulong)uVar1 % 10);
  }
  putchar(10);
  uVar2 = 0;
  do {
    if ((long)p->nVars <= (long)uVar2) {
      putchar(10);
      return;
    }
    uVar1 = p->pAssigns[uVar2];
    __c = 0x2e;
    if (uVar1 != 0xffffffff) {
      if (uVar2 != (uint)((int)uVar1 >> 1)) {
        __assert_fail("i == MSAT_LIT2VAR(p->pAssigns[i])",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/msat/msatSolverIo.c"
                      ,0x3b,"void Msat_SolverPrintAssignment(Msat_Solver_t *)");
      }
      __c = uVar1 & 1 ^ 0x31;
    }
    putchar(__c);
    uVar2 = uVar2 + 1;
  } while( true );
}

Assistant:

void Msat_SolverPrintAssignment( Msat_Solver_t * p )
{
    int i;
    printf( "Current assignments are: \n" );
    for ( i = 0; i < p->nVars; i++ )
        printf( "%d", i % 10 );
    printf( "\n" );
    for ( i = 0; i < p->nVars; i++ )
        if ( p->pAssigns[i] == MSAT_VAR_UNASSIGNED )
            printf( "." );
        else
        {
            assert( i == MSAT_LIT2VAR(p->pAssigns[i]) );
            if ( MSAT_LITSIGN(p->pAssigns[i]) )
                printf( "0" );
            else 
                printf( "1" );
        }
    printf( "\n" );
}